

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteConstBit(Bac_Ntk_t *p,int iObj,int fHead)

{
  Vec_Str_t *p_00;
  int iVar1;
  int Const;
  Vec_Str_t *vStr;
  int fHead_local;
  int iObj_local;
  Bac_Ntk_t *p_local;
  
  p_00 = p->pDesign->vOut;
  iVar1 = Bac_ObjGetConst(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Const",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xe4,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
  }
  if (fHead != 0) {
    Vec_StrPrintStr(p_00,"1\'b");
  }
  if (iVar1 == 6) {
    Vec_StrPush(p_00,'0');
  }
  else if (iVar1 == 7) {
    Vec_StrPush(p_00,'1');
  }
  else if (iVar1 == 8) {
    Vec_StrPush(p_00,'x');
  }
  else {
    if (iVar1 != 9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0xef,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
    }
    Vec_StrPush(p_00,'z');
  }
  return;
}

Assistant:

static inline void Bac_ManWriteConstBit( Bac_Ntk_t * p, int iObj, int fHead )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int Const = Bac_ObjGetConst(p, iObj);
    assert( Const );
    if ( fHead )
        Vec_StrPrintStr( vStr, "1\'b" );
    if ( Const == BAC_BOX_CF )
        Vec_StrPush( vStr, '0' );
    else if ( Const == BAC_BOX_CT )
        Vec_StrPush( vStr, '1' );
    else if ( Const == BAC_BOX_CX )
        Vec_StrPush( vStr, 'x' );
    else if ( Const == BAC_BOX_CZ )
        Vec_StrPush( vStr, 'z' );
    else assert( 0 );
}